

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiter.cc
# Opt level: O0

void absl::synchronization_internal::MaybeBecomeIdle(void)

{
  int iVar1;
  bool bVar2;
  ThreadIdentity *pTVar3;
  int wait_start;
  int ticker;
  bool is_idle;
  ThreadIdentity *identity;
  memory_order __b_1;
  memory_order __b;
  
  pTVar3 = base_internal::CurrentThreadIdentityIfPresent();
  if (pTVar3 != (ThreadIdentity *)0x0) {
    bVar2 = std::atomic<bool>::load(&pTVar3->is_idle,memory_order_relaxed);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    iVar1 = (pTVar3->ticker).super___atomic_base<int>._M_i;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if ((!bVar2) && (0x3c < iVar1 - (pTVar3->wait_start).super___atomic_base<int>._M_i)) {
      std::atomic<bool>::store(&pTVar3->is_idle,true,memory_order_relaxed);
    }
    return;
  }
  __assert_fail("identity != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/internal/waiter.cc"
                ,0x3b,"void absl::synchronization_internal::MaybeBecomeIdle()");
}

Assistant:

static void MaybeBecomeIdle() {
  base_internal::ThreadIdentity *identity =
      base_internal::CurrentThreadIdentityIfPresent();
  assert(identity != nullptr);
  const bool is_idle = identity->is_idle.load(std::memory_order_relaxed);
  const int ticker = identity->ticker.load(std::memory_order_relaxed);
  const int wait_start = identity->wait_start.load(std::memory_order_relaxed);
  if (!is_idle && ticker - wait_start > Waiter::kIdlePeriods) {
    identity->is_idle.store(true, std::memory_order_relaxed);
  }
}